

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group.c
# Opt level: O3

int ffgtdc(int grouptype,int xtensioncol,int extnamecol,int extvercol,int positioncol,
          int locationcol,int uricol,char **ttype,char **tform,int *ncols,int *status)

{
  char *pcVar1;
  undefined8 *puVar2;
  undefined4 *puVar3;
  undefined2 *puVar4;
  uint uVar5;
  
  if (*status != 0) {
    return *status;
  }
  switch(grouptype) {
  case 0:
    if (xtensioncol == 0) {
      builtin_strncpy(*ttype,"MEMBER_XTENSION",0x10);
      pcVar1 = *tform;
      pcVar1[0] = '8';
      pcVar1[1] = 'A';
      pcVar1[2] = '\0';
    }
    uVar5 = (uint)(xtensioncol == 0);
    if (extnamecol == 0) {
      puVar2 = *(undefined8 **)((long)ttype + (ulong)(uVar5 * 8));
      *puVar2 = 0x4e5f5245424d454d;
      *(undefined4 *)(puVar2 + 1) = 0x454d41;
      **(undefined4 **)((long)tform + (ulong)(uVar5 * 8)) = 0x413233;
      uVar5 = uVar5 + 1;
    }
    if (extvercol == 0) {
      puVar2 = *(undefined8 **)((long)ttype + (ulong)(uVar5 * 8));
      *(undefined8 *)((long)puVar2 + 7) = 0x4e4f4953524556;
      *puVar2 = 0x565f5245424d454d;
      puVar4 = *(undefined2 **)((long)tform + (ulong)(uVar5 * 8));
      *(undefined1 *)(puVar4 + 1) = 0;
      *puVar4 = 0x4a31;
      uVar5 = uVar5 + 1;
    }
    if (positioncol == 0) {
      builtin_strncpy(*(char **)((long)ttype + (ulong)(uVar5 * 8)),"MEMBER_POSITION",0x10);
      puVar4 = *(undefined2 **)((long)tform + (ulong)(uVar5 * 8));
      *puVar4 = 0x4a31;
      *(undefined1 *)(puVar4 + 1) = 0;
LAB_001b69c5:
      uVar5 = uVar5 + 1;
    }
    break;
  case 1:
    if (xtensioncol == 0) {
      builtin_strncpy(*ttype,"MEMBER_XTENSION",0x10);
      pcVar1 = *tform;
      pcVar1[0] = '8';
      pcVar1[1] = 'A';
      pcVar1[2] = '\0';
    }
    uVar5 = (uint)(xtensioncol == 0);
    if (extnamecol == 0) {
      puVar2 = *(undefined8 **)((long)ttype + (ulong)(uVar5 * 8));
      *puVar2 = 0x4e5f5245424d454d;
      *(undefined4 *)(puVar2 + 1) = 0x454d41;
      **(undefined4 **)((long)tform + (ulong)(uVar5 * 8)) = 0x413233;
      uVar5 = uVar5 + 1;
    }
    if (extvercol != 0) goto LAB_001b6a1a;
    puVar2 = *(undefined8 **)((long)ttype + (ulong)(uVar5 * 8));
    *(undefined8 *)((long)puVar2 + 7) = 0x4e4f4953524556;
    *puVar2 = 0x565f5245424d454d;
    puVar4 = *(undefined2 **)((long)tform + (ulong)(uVar5 * 8));
    *(undefined1 *)(puVar4 + 1) = 0;
    *puVar4 = 0x4a31;
    goto LAB_001b6a18;
  case 2:
    uVar5 = 0;
    if (positioncol == 0) {
      builtin_strncpy(*ttype,"MEMBER_POSITION",0x10);
      pcVar1 = *tform;
      pcVar1[0] = '1';
      pcVar1[1] = 'J';
      pcVar1[2] = '\0';
      uVar5 = 1;
    }
    goto LAB_001b6a1a;
  case 3:
    if (xtensioncol == 0) {
      builtin_strncpy(*ttype,"MEMBER_XTENSION",0x10);
      pcVar1 = *tform;
      pcVar1[0] = '8';
      pcVar1[1] = 'A';
      pcVar1[2] = '\0';
    }
    uVar5 = (uint)(xtensioncol == 0);
    if (extnamecol == 0) {
      puVar2 = *(undefined8 **)((long)ttype + (ulong)(uVar5 * 8));
      *puVar2 = 0x4e5f5245424d454d;
      *(undefined4 *)(puVar2 + 1) = 0x454d41;
      **(undefined4 **)((long)tform + (ulong)(uVar5 * 8)) = 0x413233;
      uVar5 = uVar5 + 1;
    }
    if (extvercol == 0) {
      puVar2 = *(undefined8 **)((long)ttype + (ulong)(uVar5 * 8));
      *(undefined8 *)((long)puVar2 + 7) = 0x4e4f4953524556;
      *puVar2 = 0x565f5245424d454d;
      puVar4 = *(undefined2 **)((long)tform + (ulong)(uVar5 * 8));
      *(undefined1 *)(puVar4 + 1) = 0;
      *puVar4 = 0x4a31;
      uVar5 = uVar5 + 1;
    }
    if (positioncol != 0) goto LAB_001b6a1a;
    builtin_strncpy(*(char **)((long)ttype + (ulong)(uVar5 * 8)),"MEMBER_POSITION",0x10);
    puVar4 = *(undefined2 **)((long)tform + (ulong)(uVar5 * 8));
    *puVar4 = 0x4a31;
    goto LAB_001b6a14;
  default:
    *status = 0x15b;
    ffpmsg("Invalid value specified for the grouptype parameter (ffgtdc)");
    uVar5 = 0;
    goto LAB_001b6a1a;
  case 0xb:
    if (xtensioncol == 0) {
      builtin_strncpy(*ttype,"MEMBER_XTENSION",0x10);
      pcVar1 = *tform;
      pcVar1[0] = '8';
      pcVar1[1] = 'A';
      pcVar1[2] = '\0';
    }
    uVar5 = (uint)(xtensioncol == 0);
    if (extnamecol == 0) {
      puVar2 = *(undefined8 **)((long)ttype + (ulong)(uVar5 * 8));
      *puVar2 = 0x4e5f5245424d454d;
      *(undefined4 *)(puVar2 + 1) = 0x454d41;
      **(undefined4 **)((long)tform + (ulong)(uVar5 * 8)) = 0x413233;
      uVar5 = uVar5 + 1;
    }
    if (extvercol == 0) {
      puVar2 = *(undefined8 **)((long)ttype + (ulong)(uVar5 * 8));
      *(undefined8 *)((long)puVar2 + 7) = 0x4e4f4953524556;
      *puVar2 = 0x565f5245424d454d;
      puVar4 = *(undefined2 **)((long)tform + (ulong)(uVar5 * 8));
      *(undefined1 *)(puVar4 + 1) = 0;
      *puVar4 = 0x4a31;
      goto LAB_001b69c5;
    }
    break;
  case 0xc:
    uVar5 = 0;
    if (positioncol == 0) {
      builtin_strncpy(*ttype,"MEMBER_POSITION",0x10);
      pcVar1 = *tform;
      pcVar1[0] = '1';
      pcVar1[1] = 'J';
      pcVar1[2] = '\0';
      uVar5 = 1;
    }
  }
  if (locationcol == 0) {
    builtin_strncpy(*(char **)((long)ttype + (ulong)(uVar5 * 8)),"MEMBER_LOCATION",0x10);
    puVar3 = *(undefined4 **)((long)tform + (ulong)(uVar5 * 8));
    *puVar3 = 0x41363532;
    *(undefined1 *)(puVar3 + 1) = 0;
    uVar5 = uVar5 + 1;
  }
  if (uricol == 0) {
    builtin_strncpy(*(char **)((long)ttype + (ulong)(uVar5 * 8)),"MEMBER_URI_TYPE",0x10);
    puVar4 = *(undefined2 **)((long)tform + (ulong)(uVar5 * 8));
    *puVar4 = 0x4133;
LAB_001b6a14:
    *(undefined1 *)(puVar4 + 1) = 0;
LAB_001b6a18:
    uVar5 = uVar5 + 1;
  }
LAB_001b6a1a:
  *ncols = uVar5;
  return *status;
}

Assistant:

int ffgtdc(int   grouptype,     /* code specifying the type of
				   grouping table information:
				   GT_ID_ALL_URI  0 ==> defualt (all columns)
				   GT_ID_REF      1 ==> ID by reference
				   GT_ID_POS      2 ==> ID by position
				   GT_ID_ALL      3 ==> ID by ref. and position
				   GT_ID_REF_URI 11 ==> (1) + URI info 
				   GT_ID_POS_URI 12 ==> (2) + URI info       */
	   int   xtensioncol, /* does MEMBER_XTENSION already exist?         */
	   int   extnamecol,  /* does MEMBER_NAME aleady exist?              */
	   int   extvercol,   /* does MEMBER_VERSION already exist?          */
	   int   positioncol, /* does MEMBER_POSITION already exist?         */
	   int   locationcol, /* does MEMBER_LOCATION already exist?         */
	   int   uricol,      /* does MEMBER_URI_TYPE aleardy exist?         */
	   char *ttype[],     /* array of grouping table column TTYPE names
				 to define (if *col var false)               */
	   char *tform[],     /* array of grouping table column TFORM values
				 to define (if*col variable false)           */
	   int  *ncols,       /* number of TTYPE and TFORM values returned   */
	   int  *status)      /* return status code                          */

/*
  create the TTYPE and TFORM values for the grouping table according to the
  value of the grouptype parameter and the values of the *col flags. The
  resulting TTYPE and TFORM are returned in ttype[] and tform[] respectively.
  The number of TTYPE and TFORMs returned is given by ncols. Both the TTYPE[]
  and TTFORM[] arrays must contain enough pre-allocated strings to hold
  the returned information.
*/

{

  int i = 0;

  char  xtension[]  = "MEMBER_XTENSION";
  char  xtenTform[] = "8A";
  
  char  name[]      = "MEMBER_NAME";
  char  nameTform[] = "32A";

  char  version[]   = "MEMBER_VERSION";
  char  verTform[]  = "1J";
  
  char  position[]  = "MEMBER_POSITION";
  char  posTform[]  = "1J";

  char  URI[]       = "MEMBER_URI_TYPE";
  char  URITform[]  = "3A";

  char  location[]  = "MEMBER_LOCATION";
  /* SPR 01720, move from 160A to 256A */
  char  locTform[]  = "256A";


  if(*status != 0) return(*status);

  switch(grouptype)
    {
      
    case GT_ID_ALL_URI:

      if(xtensioncol == 0)
	{
	  strcpy(ttype[i],xtension);
	  strcpy(tform[i],xtenTform);
	  ++i;
	}
      if(extnamecol == 0)
	{
	  strcpy(ttype[i],name);
	  strcpy(tform[i],nameTform);
	  ++i;
	}
      if(extvercol == 0)
	{
	  strcpy(ttype[i],version);
	  strcpy(tform[i],verTform);
	  ++i;
	}
      if(positioncol == 0)
	{
	  strcpy(ttype[i],position);
	  strcpy(tform[i],posTform);
	  ++i;
	}
      if(locationcol == 0)
	{
	  strcpy(ttype[i],location);
	  strcpy(tform[i],locTform);
	  ++i;
	}
      if(uricol == 0)
	{
	  strcpy(ttype[i],URI);
	  strcpy(tform[i],URITform);
	  ++i;
	}
      break;
      
    case GT_ID_REF:
      
      if(xtensioncol == 0)
	{
	  strcpy(ttype[i],xtension);
	  strcpy(tform[i],xtenTform);
	  ++i;
	}
      if(extnamecol == 0)
	{
	  strcpy(ttype[i],name);
	  strcpy(tform[i],nameTform);
	  ++i;
	}
      if(extvercol == 0)
	{
	  strcpy(ttype[i],version);
	  strcpy(tform[i],verTform);
	  ++i;
	}
      break;
      
    case GT_ID_POS:
      
      if(positioncol == 0)
	{
	  strcpy(ttype[i],position);
	  strcpy(tform[i],posTform);
	  ++i;
	}	  
      break;
      
    case GT_ID_ALL:
      
      if(xtensioncol == 0)
	{
	  strcpy(ttype[i],xtension);
	  strcpy(tform[i],xtenTform);
	  ++i;
	}
      if(extnamecol == 0)
	{
	  strcpy(ttype[i],name);
	  strcpy(tform[i],nameTform);
	  ++i;
	}
      if(extvercol == 0)
	{
	  strcpy(ttype[i],version);
	  strcpy(tform[i],verTform);
	  ++i;
	}
      if(positioncol == 0)
	{
	  strcpy(ttype[i],position);
	  strcpy(tform[i], posTform);
	  ++i;
	}	  
      
      break;
      
    case GT_ID_REF_URI:
      
      if(xtensioncol == 0)
	{
	  strcpy(ttype[i],xtension);
	  strcpy(tform[i],xtenTform);
	  ++i;
	}
      if(extnamecol == 0)
	{
	  strcpy(ttype[i],name);
	  strcpy(tform[i],nameTform);
	  ++i;
	}
      if(extvercol == 0)
	{
	  strcpy(ttype[i],version);
	  strcpy(tform[i],verTform);
	  ++i;
	}
      if(locationcol == 0)
	{
	  strcpy(ttype[i],location);
	  strcpy(tform[i],locTform);
	  ++i;
	}
      if(uricol == 0)
	{
	  strcpy(ttype[i],URI);
	  strcpy(tform[i],URITform);
	  ++i;
	}
      break;
      
    case GT_ID_POS_URI:
      
      if(positioncol == 0)
	{
	  strcpy(ttype[i],position);
	  strcpy(tform[i],posTform);
	  ++i;
	}
      if(locationcol == 0)
	{
	  strcpy(ttype[i],location);
	  strcpy(tform[i],locTform);
	  ++i;
	}
      if(uricol == 0)
	{
	  strcpy(ttype[i],URI);
	  strcpy(tform[i],URITform);
	  ++i;
	}
      break;
      
    default:
      
      *status = BAD_OPTION;
      ffpmsg("Invalid value specified for the grouptype parameter (ffgtdc)");

      break;

    }

  *ncols = i;
  
  return(*status);
}